

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O1

int archive_write_zip_finish_entry(archive_write *a)

{
  zip_conflict *zip;
  int64_t iVar1;
  uchar *puVar2;
  int iVar3;
  int iVar4;
  uchar *p;
  undefined1 *puVar5;
  uchar *__dest;
  long lVar6;
  undefined1 uVar7;
  int unaff_EBP;
  size_t sVar8;
  int iVar9;
  uchar *p_1;
  long *plVar10;
  uchar zip64 [32];
  undefined4 local_58;
  undefined8 local_54;
  undefined1 local_4c;
  undefined1 uStack_4b;
  undefined1 uStack_4a;
  undefined1 uStack_49;
  undefined1 uStack_48;
  undefined1 uStack_47;
  undefined1 uStack_46;
  undefined1 uStack_45;
  undefined1 local_44;
  undefined1 uStack_43;
  undefined1 uStack_42;
  undefined1 auStack_41 [17];
  
  zip = (zip_conflict *)a->format_data;
  if (zip->entry_compression == COMPRESSION_DEFLATE) {
    do {
      iVar3 = cm_zlib_deflate((z_streamp_conflict)&zip->stream,4);
      iVar9 = 1;
      iVar4 = -0x1e;
      if (iVar3 != -2) {
        sVar8 = zip->len_buf - (ulong)(zip->stream).avail_out;
        iVar4 = __archive_write_output(a,zip->buf,sVar8);
        if (iVar4 == 0) {
          zip->entry_compressed_written = zip->entry_compressed_written + sVar8;
          zip->written_bytes = zip->written_bytes + sVar8;
          (zip->stream).next_out = zip->buf;
          iVar9 = 2;
          iVar4 = unaff_EBP;
          if ((zip->stream).avail_out == 0) {
            (zip->stream).avail_out = (uInt)zip->len_buf;
            iVar9 = 0;
          }
        }
      }
      unaff_EBP = iVar4;
    } while (iVar9 == 0);
    if (iVar9 != 2) {
      return unaff_EBP;
    }
    cm_zlib_deflateEnd((z_streamp_conflict)&zip->stream);
  }
  if ((zip->entry_flags & 8) != 0) {
    local_58 = 0x8074b50;
    iVar1 = zip->entry_compressed_written;
    local_54 = CONCAT44((int)iVar1,zip->entry_crc32);
    if (zip->entry_uses_zip64 == 0) {
      puVar5 = &uStack_49;
      iVar1 = zip->entry_uncompressed_written;
      local_4c = (undefined1)iVar1;
      uStack_4b = (undefined1)((ulong)iVar1 >> 8);
      uStack_4a = (undefined1)((ulong)iVar1 >> 0x10);
      uVar7 = (undefined1)((ulong)iVar1 >> 0x18);
      sVar8 = 0x10;
    }
    else {
      puVar5 = auStack_41;
      local_4c = (undefined1)((ulong)iVar1 >> 0x20);
      uStack_4b = (undefined1)((ulong)iVar1 >> 0x28);
      uStack_4a = (undefined1)((ulong)iVar1 >> 0x30);
      uStack_49 = (undefined1)((ulong)iVar1 >> 0x38);
      iVar1 = zip->entry_uncompressed_written;
      uStack_48 = (undefined1)iVar1;
      uStack_47 = (undefined1)((ulong)iVar1 >> 8);
      uStack_46 = (undefined1)((ulong)iVar1 >> 0x10);
      uStack_45 = (undefined1)((ulong)iVar1 >> 0x18);
      local_44 = (undefined1)((ulong)iVar1 >> 0x20);
      uStack_43 = (undefined1)((ulong)iVar1 >> 0x28);
      uStack_42 = (undefined1)((ulong)iVar1 >> 0x30);
      uVar7 = (undefined1)((ulong)iVar1 >> 0x38);
      sVar8 = 0x18;
    }
    *puVar5 = uVar7;
    iVar4 = __archive_write_output(a,&local_58,sVar8);
    zip->written_bytes = zip->written_bytes + sVar8;
    if (iVar4 != 0) {
      return -0x1e;
    }
  }
  if (((0xffffffff < zip->entry_compressed_written) ||
      (0xffffffff < zip->entry_uncompressed_written)) || (0xffffffff < zip->entry_offset)) {
    plVar10 = &local_54;
    if (0xfffffffe < zip->entry_uncompressed_written) {
      plVar10 = (long *)&local_4c;
      local_54 = zip->entry_uncompressed_written;
    }
    if (0xfffffffe < zip->entry_compressed_written) {
      *plVar10 = zip->entry_compressed_written;
      plVar10 = plVar10 + 1;
    }
    if (0xfffffffe < zip->entry_offset) {
      *plVar10 = zip->entry_offset;
      plVar10 = plVar10 + 1;
    }
    local_58 = CONCAT22((short)plVar10 - (short)&local_54,1);
    __dest = cd_alloc(zip,(long)plVar10 - (long)&local_58);
    if (__dest == (uchar *)0x0) {
      archive_set_error(&a->archive,0xc,"Can\'t allocate zip data");
      unaff_EBP = -0x1e;
    }
    else {
      memcpy(__dest,&local_58,(long)plVar10 - (long)&local_58);
      puVar2 = zip->file_header;
      if (*(ushort *)(puVar2 + 6) < 0x2d) {
        puVar2[6] = '-';
        puVar2[7] = '\0';
      }
    }
    if (__dest == (uchar *)0x0) {
      return unaff_EBP;
    }
  }
  *(uint32_t *)(zip->file_header + 0x10) = zip->entry_crc32;
  lVar6 = zip->entry_compressed_written;
  if (0xfffffffe < lVar6) {
    lVar6 = 0xffffffff;
  }
  *(int *)(zip->file_header + 0x14) = (int)lVar6;
  lVar6 = zip->entry_uncompressed_written;
  if (0xfffffffe < lVar6) {
    lVar6 = 0xffffffff;
  }
  *(int *)(zip->file_header + 0x18) = (int)lVar6;
  *(short *)(zip->file_header + 0x1e) =
       (short)(int)zip->central_directory_bytes - (short)(int)zip->file_header_extra_offset;
  lVar6 = 0xffffffff;
  if (zip->entry_offset < 0xffffffff) {
    lVar6 = zip->entry_offset;
  }
  *(int *)(zip->file_header + 0x2a) = (int)lVar6;
  return 0;
}

Assistant:

static int
archive_write_zip_finish_entry(struct archive_write *a)
{
	struct zip *zip = a->format_data;
	int ret;

#if HAVE_ZLIB_H
	if (zip->entry_compression == COMPRESSION_DEFLATE) {
		for (;;) {
			size_t remainder;
			ret = deflate(&zip->stream, Z_FINISH);
			if (ret == Z_STREAM_ERROR)
				return (ARCHIVE_FATAL);
			remainder = zip->len_buf - zip->stream.avail_out;
			ret = __archive_write_output(a, zip->buf, remainder);
			if (ret != ARCHIVE_OK)
				return (ret);
			zip->entry_compressed_written += remainder;
			zip->written_bytes += remainder;
			zip->stream.next_out = zip->buf;
			if (zip->stream.avail_out != 0)
				break;
			zip->stream.avail_out = (uInt)zip->len_buf;
		}
		deflateEnd(&zip->stream);
	}
#endif

	/* Write trailing data descriptor. */
	if ((zip->entry_flags & ZIP_ENTRY_FLAG_LENGTH_AT_END) != 0) {
		char d[24];
		memcpy(d, "PK\007\010", 4);
		archive_le32enc(d + 4, zip->entry_crc32);
		if (zip->entry_uses_zip64) {
			archive_le64enc(d + 8, (uint64_t)zip->entry_compressed_written);
			archive_le64enc(d + 16, (uint64_t)zip->entry_uncompressed_written);
			ret = __archive_write_output(a, d, 24);
			zip->written_bytes += 24;
		} else {
			archive_le32enc(d + 8, (uint32_t)zip->entry_compressed_written);
			archive_le32enc(d + 12, (uint32_t)zip->entry_uncompressed_written);
			ret = __archive_write_output(a, d, 16);
			zip->written_bytes += 16;
		}
		if (ret != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
	}

	/* Append Zip64 extra data to central directory information. */
	if (zip->entry_compressed_written > ARCHIVE_LITERAL_LL(0xffffffff)
	    || zip->entry_uncompressed_written > ARCHIVE_LITERAL_LL(0xffffffff)
	    || zip->entry_offset > ARCHIVE_LITERAL_LL(0xffffffff)) {
		unsigned char zip64[32];
		unsigned char *z = zip64, *zd;
		memcpy(z, "\001\000\000\000", 4);
		z += 4;
		if (zip->entry_uncompressed_written >= ARCHIVE_LITERAL_LL(0xffffffff)) {
			archive_le64enc(z, zip->entry_uncompressed_written);
			z += 8;
		}
		if (zip->entry_compressed_written >= ARCHIVE_LITERAL_LL(0xffffffff)) {
			archive_le64enc(z, zip->entry_compressed_written);
			z += 8;
		}
		if (zip->entry_offset >= ARCHIVE_LITERAL_LL(0xffffffff)) {
			archive_le64enc(z, zip->entry_offset);
			z += 8;
		}
		archive_le16enc(zip64 + 2, z - (zip64 + 4));
		zd = cd_alloc(zip, z - zip64);
		if (zd == NULL) {
			archive_set_error(&a->archive, ENOMEM,
				"Can't allocate zip data");
			return (ARCHIVE_FATAL);
		}
		memcpy(zd, zip64, z - zip64);
		/* Zip64 means version needs to be set to at least 4.5 */
		if (archive_le16dec(zip->file_header + 6) < 45)
			archive_le16enc(zip->file_header + 6, 45);
	}

	/* Fix up central directory file header. */
	archive_le32enc(zip->file_header + 16, zip->entry_crc32);
	archive_le32enc(zip->file_header + 20,
	    zipmin(zip->entry_compressed_written, ARCHIVE_LITERAL_LL(0xffffffff)));
	archive_le32enc(zip->file_header + 24,
	    zipmin(zip->entry_uncompressed_written, ARCHIVE_LITERAL_LL(0xffffffff)));
	archive_le16enc(zip->file_header + 30,
	    zip->central_directory_bytes - zip->file_header_extra_offset);
	archive_le32enc(zip->file_header + 42,
	    zipmin(zip->entry_offset, ARCHIVE_LITERAL_LL(0xffffffff)));

	return (ARCHIVE_OK);
}